

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,_1,1,1,_1>>,Eigen::internal::assign_op<float,float>>
               (Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
               *src,assign_op<float,_float> *func)

{
  SrcEvaluatorType func_00;
  Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *dstExpr;
  undefined1 local_70 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>_>
  local_28;
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
  *src_local;
  Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *dst_local;
  
  srcEvaluator = (SrcEvaluatorType)func;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>_>
  ::evaluator(&local_28,src);
  resize_if_allowed<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,_1,1,1,_1>>,float,float>
            (dst,src,(assign_op<float,_float> *)srcEvaluator);
  evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::evaluator
            ((evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator;
  dstExpr = EigenBase<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
            const_cast_derived((EigenBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                                *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)local_70,(DstEvaluatorType *)&kernel.m_dstExpr,&local_28,
             (assign_op<float,_float> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_3,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_70);
  evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::~evaluator
            ((evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>_>
  ::~evaluator(&local_28);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}